

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O3

void hal_h265e_v540_set_uniform_tile
               (H265eV541RegSet *regs,H265eSyntax_new *syn,RK_U32 index,RK_S32 tile_start_x)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_4_5_07ce1e9e_for_tile_cfg aVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (((uint)(syn->pp).field_22 & 0x80) != 0) {
    uVar5 = (syn->pp).column_width_minus1[index];
    uVar4 = uVar5 & 0x3f;
    aVar3 = regs->tile_cfg;
    uVar6 = (uint)(syn->pp).pic_height * 0x400 + 0x3ffc00 & 0x3f0000;
    regs->tile_cfg =
         (anon_struct_4_5_07ce1e9e_for_tile_cfg)(uVar6 | (uint)aVar3 & 0xffc0ffc0 | uVar4);
    uVar5 = uVar5 * 0x10000 + 0x10000;
    *(short *)&(regs->rc_cfg).field_0x2 = (short)(uVar5 >> 0x10);
    regs->tile_cfg =
         (anon_struct_4_5_07ce1e9e_for_tile_cfg)
         (uVar6 | (uint)aVar3 & 0x7fc0ffc0 | uVar4 |
         ((syn->pp).field_22.CodingSettingPicturePropertyFlags & 0xffffff80) << 0x18);
    regs->tile_pos =
         (anon_struct_4_4_34e5ed23_for_tile_pos)
         ((uint)regs->tile_pos & 0xffc0ffc0 | tile_start_x & 0x3fU);
    if (index != 0) {
      uVar1 = regs->lpfw_addr_hevc;
      uVar2 = regs->lpfr_addr_hevc;
      regs->lpfw_addr_hevc = uVar2;
      regs->lpfr_addr_hevc = uVar1;
    }
    if (((byte)hal_h265e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265e_v541","tile_x %d, rc_ctu_num %d, tile_width_m1 %d",(char *)0x0,
                 (ulong)(tile_start_x & 0x3fU),(ulong)(uVar5 >> 0x10),(ulong)uVar4);
    }
  }
  return;
}

Assistant:

void hal_h265e_v540_set_uniform_tile(H265eV541RegSet *regs, H265eSyntax_new *syn,
                                     RK_U32 index, RK_S32 tile_start_x)
{
    if (syn->pp.tiles_enabled_flag) {
        RK_S32 mb_h = MPP_ALIGN(syn->pp.pic_height, 64) / 64;
        RK_S32 tile_width = syn->pp.column_width_minus1[index] + 1;

        regs->tile_cfg.tile_width_m1 = tile_width - 1;
        regs->tile_cfg.tile_height_m1 = mb_h - 1;
        regs->rc_cfg.rc_ctu_num   = tile_width;
        regs->tile_cfg.tile_en = syn->pp.tiles_enabled_flag;
        regs->tile_pos.tile_x = tile_start_x;
        regs->tile_pos.tile_y = 0;
        if (index > 0) {
            RK_U32 tmp = regs->lpfr_addr_hevc;
            regs->lpfr_addr_hevc = regs->lpfw_addr_hevc;
            regs->lpfw_addr_hevc = tmp;
        }

        hal_h265e_dbg_detail("tile_x %d, rc_ctu_num %d, tile_width_m1 %d",
                             regs->tile_pos.tile_x, regs->rc_cfg.rc_ctu_num,
                             regs->tile_cfg.tile_width_m1);
    }
}